

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O2

void dequantize_row_iq3_s(block_iq3_s *x,float *y,int64_t k)

{
  float fVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int l;
  long lVar11;
  uint8_t *puVar12;
  int ib32;
  ulong uVar13;
  uint8_t *puVar14;
  uint8_t *puVar15;
  float fVar16;
  float fVar17;
  
  lVar9 = 0;
  lVar8 = k / 0x100;
  if (k / 0x100 < 1) {
    lVar8 = lVar9;
  }
  for (; lVar9 != lVar8; lVar9 = lVar9 + 1) {
    puVar14 = x[lVar9].qs;
    fVar1 = ggml_table_f32_f16[x[lVar9].d];
    puVar15 = x[lVar9].qh;
    puVar12 = x[lVar9].signs;
    for (uVar13 = 0; uVar13 < 8; uVar13 = uVar13 + 2) {
      bVar2 = x[lVar9].scales[uVar13 >> 1];
      fVar16 = (float)(byte)((bVar2 & 0xf) * '\x02' + 1) * fVar1;
      bVar3 = *puVar15;
      for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
        bVar4 = puVar14[lVar11 * 2];
        bVar5 = puVar14[lVar11 * 2 + 1];
        bVar6 = puVar12[lVar11];
        for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
          fVar17 = (float)*(byte *)((long)iq3s_grid +
                                   (ulong)(((uint)bVar3 << ((char)lVar11 * -2 + 8U & 0x1f) & 0x100 |
                                           (uint)bVar4) << 2) + lVar10) * fVar16;
          if ((kmask_iq2xs[lVar10] & bVar6) != 0) {
            fVar17 = -fVar17;
          }
          bVar7 = *(byte *)((long)iq3s_grid +
                           (ulong)(((uint)bVar3 << ((char)lVar11 * -2 + 7U & 0x1f) & 0x100 |
                                   (uint)bVar5) << 2) + lVar10);
          y[lVar10] = fVar17;
          fVar17 = (float)bVar7 * fVar16;
          if ((kmask_iq2xs[lVar10 + 4] & bVar6) != 0) {
            fVar17 = -fVar17;
          }
          y[lVar10 + 4] = fVar17;
        }
        y = y + 8;
      }
      fVar16 = (float)(byte)(bVar2 >> 3 | 1) * fVar1;
      bVar2 = puVar15[1];
      for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
        bVar3 = puVar14[lVar11 * 2 + 8];
        bVar4 = puVar14[lVar11 * 2 + 9];
        bVar5 = puVar12[lVar11 + 4];
        for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
          fVar17 = (float)*(byte *)((long)iq3s_grid +
                                   (ulong)(((uint)bVar2 << ((char)lVar11 * -2 + 8U & 0x1f) & 0x100 |
                                           (uint)bVar3) << 2) + lVar10) * fVar16;
          if ((kmask_iq2xs[lVar10] & bVar5) != 0) {
            fVar17 = -fVar17;
          }
          bVar6 = *(byte *)((long)iq3s_grid +
                           (ulong)(((uint)bVar2 << ((char)lVar11 * -2 + 7U & 0x1f) & 0x100 |
                                   (uint)bVar4) << 2) + lVar10);
          y[lVar10] = fVar17;
          fVar17 = (float)bVar6 * fVar16;
          if ((kmask_iq2xs[lVar10 + 4] & bVar5) != 0) {
            fVar17 = -fVar17;
          }
          y[lVar10 + 4] = fVar17;
        }
        y = y + 8;
      }
      puVar15 = puVar15 + 2;
      puVar14 = puVar14 + 0x10;
      puVar12 = puVar12 + 8;
    }
  }
  return;
}

Assistant:

void dequantize_row_iq3_s(const block_iq3_s * GGML_RESTRICT x, float * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int64_t nb = k / QK_K;

    for (int i = 0; i < nb; i++) {

        const float d = GGML_FP16_TO_FP32(x[i].d);
        const uint8_t * qs = x[i].qs;
        const uint8_t * qh = x[i].qh;
        const uint8_t * signs = x[i].signs;

        for (int ib32 = 0; ib32 < QK_K/32; ib32 += 2) {
            const float db1 = d * (1 + 2*(x[i].scales[ib32/2] & 0xf));
            const float db2 = d * (1 + 2*(x[i].scales[ib32/2] >>  4));
            for (int l = 0; l < 4; ++l) {
                const uint8_t * grid1 = (const uint8_t *)(iq3s_grid + (qs[2*l+0] | ((qh[0] << (8-2*l)) & 256)));
                const uint8_t * grid2 = (const uint8_t *)(iq3s_grid + (qs[2*l+1] | ((qh[0] << (7-2*l)) & 256)));
                for (int j = 0; j < 4; ++j) {
                    y[j+0] = db1 * grid1[j] * (signs[l] & kmask_iq2xs[j+0] ? -1.f : 1.f);
                    y[j+4] = db1 * grid2[j] * (signs[l] & kmask_iq2xs[j+4] ? -1.f : 1.f);
                }
                y += 8;
            }
            qs += 8;
            signs += 4;
            for (int l = 0; l < 4; ++l) {
                const uint8_t * grid1 = (const uint8_t *)(iq3s_grid + (qs[2*l+0] | ((qh[1] << (8-2*l)) & 256)));
                const uint8_t * grid2 = (const uint8_t *)(iq3s_grid + (qs[2*l+1] | ((qh[1] << (7-2*l)) & 256)));
                for (int j = 0; j < 4; ++j) {
                    y[j+0] = db2 * grid1[j] * (signs[l] & kmask_iq2xs[j+0] ? -1.f : 1.f);
                    y[j+4] = db2 * grid2[j] * (signs[l] & kmask_iq2xs[j+4] ? -1.f : 1.f);
                }
                y += 8;
            }
            qh += 2;
            qs += 8;
            signs += 4;
        }
    }
}